

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

int __thiscall
Player::executeAttack
          (Player *this,Country *fromCountry,Country *toCountry,Player *defendingPlayer,
          int numAttackingDice,int numDefendingDice)

{
  pointer pcVar1;
  int *piVar2;
  vector<Map::Country*,std::allocator<Map::Country*>> *this_00;
  iterator __position;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  pointer ppCVar8;
  ulong uVar9;
  PlayerState *pPVar10;
  GameLoop *pGVar11;
  int iVar12;
  pointer ppCVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  vector<int,_std::allocator<int>_> attackingRolls;
  vector<int,_std::allocator<int>_> defendingRolls;
  long *local_b0;
  size_t local_a8;
  long local_a0 [2];
  Country *local_90;
  long *local_88;
  size_t local_80;
  long local_78 [2];
  Player *local_68;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_90 = fromCountry;
  DiceRoller::roll(&local_60,this->pDiceRoller,numAttackingDice);
  local_68 = defendingPlayer;
  DiceRoller::roll(&local_48,defendingPlayer->pDiceRoller,numDefendingDice);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," - ",3);
  pcVar1 = (local_90->cyName->_M_dataplus)._M_p;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + local_90->cyName->_M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_b0,local_a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," is attacking ",0xe);
  local_88 = local_78;
  pcVar1 = (toCountry->cyName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + toCountry->cyName->_M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_88,local_80);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," - ",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) break;
      iVar5 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish[-1];
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      iVar6 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish[-1];
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nAttacker rolled a ",0x13);
      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,". Defender rolled a ",0x14);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (iVar6 < iVar5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\n[DEFENDER] Defender lost 1 army!",0x21);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
        piVar2 = toCountry->pNumberOfTroops;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\n[DEFENDER] Defender has lost possession of country ",
                     0x34);
          pcVar1 = (toCountry->cyName->_M_dataplus)._M_p;
          local_b0 = local_a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar1,pcVar1 + toCountry->cyName->_M_string_length);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_b0,local_a8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if (local_b0 != local_a0) {
            operator_delete(local_b0,local_a0[0] + 1);
          }
          *toCountry->pPlayerOwnerId = *this->pPlayerId;
          ppCVar13 = (local_68->pOwnedCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          ppCVar8 = (local_68->pOwnedCountries->
                    super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppCVar8 == ppCVar13) goto LAB_0010d0f1;
          lVar15 = -8;
          lVar16 = 0;
          uVar14 = 0;
          goto LAB_0010cff9;
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\nAttacker lost 1 army!",0x16);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
        *local_90->pNumberOfTroops = *local_90->pNumberOfTroops + -1;
      }
    } while (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start !=
             local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  }
  operator_delete(this->currentState,4);
  pPVar10 = (PlayerState *)operator_new(4);
  *pPVar10 = IDLE;
  this->currentState = pPVar10;
  goto LAB_0010cedb;
  while( true ) {
    uVar14 = uVar14 + 1;
    lVar15 = lVar15 + -8;
    lVar16 = lVar16 + -8;
    if (uVar9 <= uVar14) break;
LAB_0010cff9:
    uVar9 = (long)ppCVar8 - (long)ppCVar13 >> 3;
    if (uVar9 <= uVar14) {
LAB_0010d2cc:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
                 uVar9);
    }
    pcVar1 = (ppCVar13[uVar14]->cyName->_M_dataplus)._M_p;
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + ppCVar13[uVar14]->cyName->_M_string_length);
    local_88 = local_78;
    pcVar1 = (toCountry->cyName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar1,pcVar1 + toCountry->cyName->_M_string_length);
    plVar4 = local_88;
    if (local_a8 == local_80) {
      if (local_a8 == 0) {
        bVar17 = true;
      }
      else {
        iVar5 = bcmp(local_b0,local_88,local_a8);
        bVar17 = iVar5 == 0;
      }
    }
    else {
      bVar17 = false;
    }
    if (plVar4 != local_78) {
      operator_delete(plVar4,local_78[0] + 1);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
    ppCVar13 = (local_68->pOwnedCountries->
               super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    ppCVar8 = (local_68->pOwnedCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar9 = (long)ppCVar8 - (long)ppCVar13 >> 3;
    if (bVar17) {
      if (uVar9 <= uVar14) goto LAB_0010d2cc;
      this_00 = (vector<Map::Country*,std::allocator<Map::Country*>> *)this->pOwnedCountries;
      __position._M_current = *(Country ***)(this_00 + 8);
      if (__position._M_current == *(Country ***)(this_00 + 0x10)) {
        std::vector<Map::Country*,std::allocator<Map::Country*>>::
        _M_realloc_insert<Map::Country*const&>
                  (this_00,__position,(Country **)((long)ppCVar13 - lVar16));
      }
      else {
        *__position._M_current = ppCVar13[uVar14];
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      pvVar3 = local_68->pOwnedCountries;
      ppCVar13 = (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      ppCVar8 = (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      if ((pointer)((long)ppCVar13 - lVar15) != ppCVar8) {
        memmove(ppCVar13 + uVar14,ppCVar13 + uVar14 + 1,(long)ppCVar8 + (lVar15 - (long)ppCVar13));
        ppCVar8 = (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = ppCVar8 + -1;
      goto LAB_0010d1b4;
    }
  }
LAB_0010d0f1:
  operator_delete(this->currentState,4);
  pPVar10 = (PlayerState *)operator_new(4);
  *pPVar10 = IDLE;
  this->currentState = pPVar10;
  iVar5 = -1;
  goto LAB_0010cee0;
  while( true ) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nInvalid number! Try again.",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    if ((0 < iVar6) && (iVar6 < *local_90->pNumberOfTroops)) break;
LAB_0010d1b4:
    pGVar11 = GameLoop::getInstance();
    Deck::draw(pGVar11->gameDeck,this->pCards);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "\n[ATTACKER] How many armies do you want to place on your new country?(1 to ",0x4b);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cout,*local_90->pNumberOfTroops + -1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
    iVar6 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,4);
    iVar5 = *local_90->pNumberOfTroops;
    iVar12 = iVar5 - iVar6;
    if ((0 < iVar6 && (iVar12 != 0 && iVar6 <= iVar5)) &&
       (((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) == 0)) {
      *local_90->pNumberOfTroops = iVar12;
      *toCountry->pNumberOfTroops = iVar6;
      break;
    }
  }
  operator_delete(this->currentState,4);
  pPVar10 = (PlayerState *)operator_new(4);
  *pPVar10 = IDLE;
  this->currentState = pPVar10;
LAB_0010cedb:
  iVar5 = 1;
LAB_0010cee0:
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar5;
}

Assistant:

int
Player::executeAttack(Map::Country *fromCountry, Map::Country *toCountry, Player *defendingPlayer, int numAttackingDice,
                      int numDefendingDice) {
    /*
     * 1. The attacking player rolls 1-3 dice, having +1 army than dice rolled. 1 dice roll per attacking army.
     * 2. Defender rolls 2 dice, 1 for each army defending
     * 3. Compare highest dice rolls per army, defender wins ties. lower number loses army
     * 4. If the defending country loses all its armies, the attacking country has to place
     * at least 1 of the attacking armies on the conquered country, up to all but one army
     */

    // Roll
    std::vector<int> attackingRolls = this->getDiceRoller()->roll(numAttackingDice);
    std::vector<int> defendingRolls = defendingPlayer->getDiceRoller()->roll(numDefendingDice);
    std::cout << std::endl << " - " << fromCountry->getCountryName() << " is attacking " << toCountry->getCountryName() << " - "<<std::endl;

    // Compare the rolls, decide who wins and change number of armies of each country. Maybe update if attacking wins
    while (!attackingRolls.empty() && !defendingRolls.empty()) {
        int aRoll = attackingRolls.back();
        int dRoll = defendingRolls.back();
        attackingRolls.pop_back();
        defendingRolls.pop_back();
        std::cout << "\nAttacker rolled a " << aRoll << ". Defender rolled a " << dRoll << "." << std::endl;
        if (aRoll > dRoll) {
            // defender loses 1 army
            std::cout << "\n[DEFENDER] Defender lost 1 army!" << std::endl;
            toCountry->setNumberOfTroops(toCountry->getNumberOfTroops() - 1);
            // then, if no armies left on defending country, attacking player conquers it
            if (toCountry->getNumberOfTroops() == 0) {
                std::cout << "\n[DEFENDER] Defender has lost possession of country " << toCountry->getCountryName()
                          << std::endl;
                if (!exchangeCountryOwnership(*this, defendingPlayer, *toCountry)) {
                    this->setPlayerState(PlayerState::IDLE);
                    return PlayerAction::FAILED;
                } else {
                    int newArmies = 0;
                    do {
                        GameLoop::getInstance()->getGameDeck()->draw(*this->getCards());
                        cout << "\n[ATTACKER] How many armies do you want to place on your new country?(1 to "
                             << fromCountry->getNumberOfTroops() - 1 << ")";
                        newArmies = strategy->intInput(StrategyContext::ATTACK_NEW_ARMY_COUNT);
                        if (newArmies > fromCountry->getNumberOfTroops() - 1 || newArmies < 1 || cin.fail() || isnan(newArmies)) {
                            cout << "\nInvalid number! Try again." << std::endl;
                            continue;
                        } else {
                            fromCountry->setNumberOfTroops(fromCountry->getNumberOfTroops() - newArmies);
                            toCountry->setNumberOfTroops(newArmies);
                            break;
                        }
                    } while (newArmies > fromCountry->getNumberOfTroops() - 1 || newArmies < 1);
                    this->setPlayerState(PlayerState::IDLE);
                    return PlayerAction::SUCCEEDED;
                }
            }
        } else {
            // attacker loses 1 army
            std::cout << "\nAttacker lost 1 army!" << std::endl;
            fromCountry->setNumberOfTroops(fromCountry->getNumberOfTroops() - 1);
        }
    }
    this->setPlayerState(PlayerState::IDLE);
    return PlayerAction::SUCCEEDED;
}